

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O2

ASN1_BIT_STRING * c2i_ASN1_BIT_STRING(ASN1_BIT_STRING **a,uchar **pp,long length)

{
  byte bVar1;
  byte *pbVar2;
  ASN1_BIT_STRING *a_00;
  uchar *puVar3;
  int iVar4;
  int iVar5;
  byte *data;
  
  if (length < 1) {
    iVar5 = 0x7a;
    iVar4 = 0xae;
LAB_003c8538:
    ERR_put_error(0xc,0,iVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                  ,iVar5);
    return (ASN1_BIT_STRING *)0x0;
  }
  if ((ulong)length >> 0x1f != 0) {
    iVar5 = 0x7f;
    iVar4 = 0xad;
    goto LAB_003c8538;
  }
  if (((a == (ASN1_BIT_STRING **)0x0) || (a_00 = *a, a_00 == (ASN1_BIT_STRING *)0x0)) &&
     (a_00 = ASN1_BIT_STRING_new(), a_00 == (ASN1_BIT_STRING *)0x0)) {
    return (ASN1_BIT_STRING *)0x0;
  }
  pbVar2 = *pp;
  bVar1 = *pbVar2;
  if (bVar1 < 8) {
    data = pbVar2 + 1;
    if ((bVar1 == 0) ||
       ((length != 1 && (((uint)pbVar2[length + -1] & ~(-1 << (bVar1 & 0x1f))) == 0)))) {
      a_00->flags = a_00->flags & 0xfffffffffffffff0U | (ulong)bVar1 | 8;
      if (length == 1) {
        puVar3 = (uchar *)0x0;
LAB_003c862a:
        a_00->length = (int)(length - 1U);
        OPENSSL_free(a_00->data);
        a_00->data = puVar3;
        a_00->type = 3;
        if (a != (ASN1_BIT_STRING **)0x0) {
          *a = a_00;
        }
        *pp = data;
        return a_00;
      }
      puVar3 = (uchar *)OPENSSL_memdup(data,length - 1U);
      if (puVar3 != (uchar *)0x0) {
        data = pbVar2 + length;
        goto LAB_003c862a;
      }
      goto LAB_003c85c3;
    }
    iVar4 = 0xc2;
    iVar5 = 0x96;
  }
  else {
    iVar4 = 0x8d;
    iVar5 = 0x8f;
  }
  ERR_put_error(0xc,0,iVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                ,iVar5);
LAB_003c85c3:
  if ((a == (ASN1_BIT_STRING **)0x0) || (*a != a_00)) {
    ASN1_BIT_STRING_free(a_00);
  }
  return (ASN1_BIT_STRING *)0x0;
}

Assistant:

ASN1_BIT_STRING *c2i_ASN1_BIT_STRING(ASN1_BIT_STRING **a,
                                     const unsigned char **pp, long len) {
  ASN1_BIT_STRING *ret = NULL;
  const unsigned char *p;
  unsigned char *s;
  int padding;
  uint8_t padding_mask;

  if (len < 1) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_STRING_TOO_SHORT);
    goto err;
  }

  if (len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_STRING_TOO_LONG);
    goto err;
  }

  if ((a == NULL) || ((*a) == NULL)) {
    if ((ret = ASN1_BIT_STRING_new()) == NULL) {
      return NULL;
    }
  } else {
    ret = (*a);
  }

  p = *pp;
  padding = *(p++);
  len--;
  if (padding > 7) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_BIT_STRING_BITS_LEFT);
    goto err;
  }

  // Unused bits in a BIT STRING must be zero.
  padding_mask = (1 << padding) - 1;
  if (padding != 0 && (len < 1 || (p[len - 1] & padding_mask) != 0)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_BIT_STRING_PADDING);
    goto err;
  }

  // We do this to preserve the settings.  If we modify the settings, via
  // the _set_bit function, we will recalculate on output
  ret->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);    // clear
  ret->flags |= (ASN1_STRING_FLAG_BITS_LEFT | padding);  // set

  if (len > 0) {
    s = reinterpret_cast<uint8_t *>(OPENSSL_memdup(p, len));
    if (s == NULL) {
      goto err;
    }
    p += len;
  } else {
    s = NULL;
  }

  ret->length = (int)len;
  OPENSSL_free(ret->data);
  ret->data = s;
  ret->type = V_ASN1_BIT_STRING;
  if (a != NULL) {
    (*a) = ret;
  }
  *pp = p;
  return ret;
err:
  if ((ret != NULL) && ((a == NULL) || (*a != ret))) {
    ASN1_BIT_STRING_free(ret);
  }
  return NULL;
}